

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer-source-line-finder.cc
# Opt level: O0

Result __thiscall
wabt::LexerSourceLineFinder::GetLineOffsets
          (LexerSourceLineFinder *this,int find_line,OffsetRange *out_range)

{
  Offset OVar1;
  bool bVar2;
  Result result;
  pointer pLVar3;
  char *dest;
  size_type sVar4;
  size_t __n;
  reference pcVar5;
  difference_type dVar6;
  OffsetRange OVar7;
  byte local_b9;
  unsigned_long local_b0;
  unsigned_long local_a8;
  unsigned_long local_a0;
  Offset end_1;
  unsigned_long local_90;
  Offset line_offset;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> end;
  iterator iter;
  size_t read_size;
  Offset local_68;
  Offset buffer_file_offset;
  undefined1 local_58 [8];
  vector<char,_std::allocator<char>_> buffer;
  size_t kBufferSize;
  unsigned_long local_30;
  OffsetRange *out_range_local;
  int find_line_local;
  LexerSourceLineFinder *this_local;
  
  bVar2 = IsLineCached(this,find_line);
  if (bVar2) {
    OVar7 = GetCachedLine(this,find_line);
    kBufferSize = OVar7.start;
    out_range->start = kBufferSize;
    local_30 = OVar7.end;
    out_range->end = local_30;
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  else {
    buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ = 0x10000;
    std::allocator<char>::allocator();
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)local_58,0x10000,
               (allocator_type *)((long)&buffer_file_offset + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&buffer_file_offset + 7));
    bVar2 = std::vector<wabt::Range<unsigned_long>,_std::allocator<wabt::Range<unsigned_long>_>_>::
            empty(&this->line_ranges_);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      __assert_fail("!line_ranges_.empty()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/lexer-source-line-finder.cc"
                    ,0x58,"Result wabt::LexerSourceLineFinder::GetLineOffsets(int, OffsetRange *)");
    }
    local_68 = 0;
    while( true ) {
      bVar2 = IsLineCached(this,find_line);
      local_b9 = 0;
      if (!bVar2) {
        local_b9 = this->eof_ ^ 0xff;
      }
      if ((local_b9 & 1) == 0) {
        bVar2 = IsLineCached(this,find_line);
        if (bVar2) {
          OVar7 = GetCachedLine(this,find_line);
          local_b0 = OVar7.start;
          out_range->start = local_b0;
          local_a8 = OVar7.end;
          out_range->end = local_a8;
          Result::Result((Result *)((long)&this_local + 4),Ok);
        }
        else {
          if ((this->eof_ & 1U) == 0) {
            __assert_fail("eof_",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/lexer-source-line-finder.cc"
                          ,0x78,
                          "Result wabt::LexerSourceLineFinder::GetLineOffsets(int, OffsetRange *)");
          }
          Result::Result((Result *)((long)&this_local + 4),Error);
        }
        goto LAB_00278717;
      }
      pLVar3 = std::unique_ptr<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_>::
               operator->(&this->source_);
      result = LexerSource::Tell(pLVar3,&local_68);
      bVar2 = Failed(result);
      if (bVar2) break;
      pLVar3 = std::unique_ptr<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_>::
               operator->(&this->source_);
      dest = std::vector<char,_std::allocator<char>_>::data
                       ((vector<char,_std::allocator<char>_> *)local_58);
      sVar4 = std::vector<char,_std::allocator<char>_>::size
                        ((vector<char,_std::allocator<char>_> *)local_58);
      __n = LexerSource::Fill(pLVar3,dest,sVar4);
      sVar4 = std::vector<char,_std::allocator<char>_>::size
                        ((vector<char,_std::allocator<char>_> *)local_58);
      if (__n < sVar4) {
        this->eof_ = true;
      }
      end._M_current =
           (char *)std::vector<char,_std::allocator<char>_>::begin
                             ((vector<char,_std::allocator<char>_> *)local_58);
      line_offset = (Offset)__gnu_cxx::
                            __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
                            operator+(&end,__n);
      while (bVar2 = __gnu_cxx::operator<
                               (&end,(__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>
                                      *)&line_offset), bVar2) {
        pcVar5 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
                 operator*(&end);
        OVar1 = local_68;
        if (*pcVar5 == '\n') {
          end_1 = (Offset)std::vector<char,_std::allocator<char>_>::begin
                                    ((vector<char,_std::allocator<char>_> *)local_58);
          dVar6 = __gnu_cxx::operator-
                            (&end,(__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>
                                   *)&end_1);
          local_90 = (OVar1 + dVar6) - (ulong)(this->last_cr_ & 1);
          std::vector<wabt::Range<unsigned_long>,std::allocator<wabt::Range<unsigned_long>>>::
          emplace_back<unsigned_long&,unsigned_long&>
                    ((vector<wabt::Range<unsigned_long>,std::allocator<wabt::Range<unsigned_long>>>
                      *)&this->line_ranges_,&this->next_line_start_,&local_90);
          this->next_line_start_ = local_90 + (this->last_cr_ & 1) + 1;
        }
        pcVar5 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
                 operator*(&end);
        this->last_cr_ = *pcVar5 == '\r';
        __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::operator++
                  (&end);
      }
      if ((this->eof_ & 1U) != 0) {
        local_a0 = local_68 + __n;
        std::vector<wabt::Range<unsigned_long>,std::allocator<wabt::Range<unsigned_long>>>::
        emplace_back<unsigned_long&,unsigned_long&>
                  ((vector<wabt::Range<unsigned_long>,std::allocator<wabt::Range<unsigned_long>>> *)
                   &this->line_ranges_,&this->next_line_start_,&local_a0);
      }
    }
    Result::Result((Result *)((long)&this_local + 4),Error);
LAB_00278717:
    std::vector<char,_std::allocator<char>_>::~vector
              ((vector<char,_std::allocator<char>_> *)local_58);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result LexerSourceLineFinder::GetLineOffsets(int find_line,
                                             OffsetRange* out_range) {
  if (IsLineCached(find_line)) {
    *out_range = GetCachedLine(find_line);
    return Result::Ok;
  }

  const size_t kBufferSize = 1 << 16;
  std::vector<char> buffer(kBufferSize);

  assert(!line_ranges_.empty());
  Offset buffer_file_offset = 0;
  while (!IsLineCached(find_line) && !eof_) {
    CHECK_RESULT(source_->Tell(&buffer_file_offset));
    size_t read_size = source_->Fill(buffer.data(), buffer.size());
    if (read_size < buffer.size()) {
      eof_ = true;
    }

    for (auto iter = buffer.begin(), end = iter + read_size; iter < end;
         ++iter) {
      if (*iter == '\n') {
        // Don't include \n or \r in the line range.
        Offset line_offset =
            buffer_file_offset + (iter - buffer.begin()) - last_cr_;
        line_ranges_.emplace_back(next_line_start_, line_offset);
        next_line_start_ = line_offset + last_cr_ + 1;
      }
      last_cr_ = *iter == '\r';
    }

    if (eof_) {
      // Add the final line as an empty range.
      Offset end = buffer_file_offset + read_size;
      line_ranges_.emplace_back(next_line_start_, end);
    }
  }

  if (IsLineCached(find_line)) {
    *out_range = GetCachedLine(find_line);
    return Result::Ok;
  } else {
    assert(eof_);
    return Result::Error;
  }
}